

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

bool nite::mouseReleased(uint Button)

{
  uint uVar1;
  bool local_9;
  uint Button_local;
  
  uVar1 = Button - 0xc9;
  if (uVar1 < 0x65) {
    if ((isbuttonStateReleased[uVar1] & 1U) == 0) {
      if ((buttonState[uVar1] & 1U) == 0) {
        if (((buttonState[uVar1] & 1U) == 0) && ((buttonStateReleased[uVar1] & 1U) != 0)) {
          buttonStateReleased[uVar1] = false;
          isbuttonStateReleased[uVar1] = true;
          local_9 = true;
        }
        else {
          local_9 = false;
        }
      }
      else {
        buttonStateReleased[uVar1] = true;
        local_9 = false;
      }
    }
    else {
      local_9 = true;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool nite::mouseReleased(unsigned Button){
	Button -= 201;
	if (Button >= niteKeysn){
		return 0;
	}

	if (isbuttonStateReleased[Button]){
		return 1;
	}

	if (buttonState[Button]){
		buttonStateReleased[Button] = 1;
		return 0;
	}

	if (!buttonState[Button] and buttonStateReleased[Button]){
		buttonStateReleased[Button] = 0;
		isbuttonStateReleased[Button] = 1;
		return 1;
	}

	return 0;
}